

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# max_flow.h
# Opt level: O0

void __thiscall max_flow_algo::gap_heuristic(max_flow_algo *this,NodeID level)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  int *piVar5;
  int local_18;
  NodeID node;
  NodeID level_local;
  max_flow_algo *this_local;
  
  this->m_gaps = this->m_gaps + 1;
  for (local_18 = 0;
      sVar3 = std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::size(this->adj), (ulong)(long)local_18 < sVar3; local_18 = local_18 + 1) {
    bVar2 = isActive(this,local_18);
    if ((bVar2) &&
       (pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&this->m_distance,(long)local_18), level <= *pvVar4)) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_distance,(long)local_18);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_count,(long)*pvVar4);
      *pvVar4 = *pvVar4 + -1;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_distance,(long)local_18);
      piVar5 = std::max<int>(pvVar4,&this->rn);
      iVar1 = *piVar5;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_distance,(long)local_18);
      *pvVar4 = iVar1;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_distance,(long)local_18);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->m_count,(long)*pvVar4);
      *pvVar4 = *pvVar4 + 1;
      enqueue(this,local_18);
    }
  }
  return;
}

Assistant:

void gap_heuristic(NodeID level)
    {
        m_gaps++;
        for (NodeID node = 0; node < adj.size(); node++)
        {
            if (isActive(node))
            {
                if (m_distance[node] < level)
                    continue;
                m_count[m_distance[node]]--;
                m_distance[node] = std::max(m_distance[node], rn);
                m_count[m_distance[node]]++;
                enqueue(node);
            }
        }
    }